

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

OPJ_BOOL opj_bio_flush(opj_bio_t *bio)

{
  OPJ_BOOL OVar1;
  opj_bio_t *bio_local;
  
  OVar1 = opj_bio_byteout(bio);
  if (OVar1 == 0) {
    bio_local._4_4_ = 0;
  }
  else if ((bio->ct == 7) && (OVar1 = opj_bio_byteout(bio), OVar1 == 0)) {
    bio_local._4_4_ = 0;
  }
  else {
    bio_local._4_4_ = 1;
  }
  return bio_local._4_4_;
}

Assistant:

OPJ_BOOL opj_bio_flush(opj_bio_t *bio)
{
    if (! opj_bio_byteout(bio)) {
        return OPJ_FALSE;
    }
    if (bio->ct == 7) {
        if (! opj_bio_byteout(bio)) {
            return OPJ_FALSE;
        }
    }
    return OPJ_TRUE;
}